

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.c
# Opt level: O2

void av1_setup_scale_factors_for_frame
               (scale_factors *sf,int other_w,int other_h,int this_w,int this_h)

{
  int iVar1;
  int iVar2;
  
  if ((other_h << 4 < this_h || other_w * 0x10 < this_w) ||
      (this_h * 2 < other_h || this_w * 2 < other_w)) {
    iVar2 = -1;
    iVar1 = iVar2;
  }
  else {
    iVar2 = (this_w / 2 + other_w * 0x4000) / this_w;
    iVar1 = (this_h / 2 + other_h * 0x4000) / this_h;
    sf->x_step_q4 = iVar2 + 8 >> 4;
    sf->y_step_q4 = iVar1 + 8 >> 4;
  }
  sf->x_scale_fp = iVar2;
  sf->y_scale_fp = iVar1;
  return;
}

Assistant:

void av1_setup_scale_factors_for_frame(struct scale_factors *sf, int other_w,
                                       int other_h, int this_w, int this_h) {
  if (!valid_ref_frame_size(other_w, other_h, this_w, this_h)) {
    sf->x_scale_fp = REF_INVALID_SCALE;
    sf->y_scale_fp = REF_INVALID_SCALE;
    return;
  }

  sf->x_scale_fp = get_fixed_point_scale_factor(other_w, this_w);
  sf->y_scale_fp = get_fixed_point_scale_factor(other_h, this_h);

  sf->x_step_q4 = fixed_point_scale_to_coarse_point_scale(sf->x_scale_fp);
  sf->y_step_q4 = fixed_point_scale_to_coarse_point_scale(sf->y_scale_fp);
}